

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

_Bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)

{
  _func_void *p_Var1;
  ALLEGRO_SYSTEM *pAVar2;
  ALLEGRO_USER_EVENT *event;
  _Bool _Var3;
  
  pAVar2 = al_get_system_driver();
  p_Var1 = pAVar2->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  if (queue->events_head == queue->events_tail) {
    _Var3 = false;
  }
  else {
    event = (ALLEGRO_USER_EVENT *)_al_vector_ref(&queue->events,queue->events_tail);
    _Var3 = false;
    queue->events_tail = (uint)((ulong)(queue->events_tail + 1) % (queue->events)._size);
    if ((event != (ALLEGRO_USER_EVENT *)0x0) && (_Var3 = true, 0x1ff < event->type)) {
      al_unref_user_event(event);
    }
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  return _Var3;
}

Assistant:

bool al_drop_next_event(ALLEGRO_EVENT_QUEUE *queue)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, true);
   if (next_event) {
      unref_if_user_event(next_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}